

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
boost::exception_detail::error_info_injector<boost::system::system_error>::error_info_injector
          (error_info_injector<boost::system::system_error> *this,system_error *x)

{
  system_error *in_RSI;
  undefined8 *in_RDI;
  exception *in_stack_ffffffffffffffe0;
  system_error *in_stack_ffffffffffffffe8;
  
  system::system_error::system_error(in_RSI,in_stack_ffffffffffffffe8);
  exception::exception(in_stack_ffffffffffffffe0);
  *in_RDI = &PTR__error_info_injector_00139e00;
  in_RDI[8] = &PTR__error_info_injector_00139e28;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }